

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

iteration_time __thiscall
helics::FederateState::enterExecutingMode
          (FederateState *this,IterationRequest iterate,bool sendRequest)

{
  MessageTimer *pMVar1;
  __atomic_flag_data_type _Var2;
  FederateStates FVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  MessageProcessingResult result;
  undefined7 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  rep rVar6;
  Time TVar7;
  ulong uVar8;
  enable_shared_from_this<helics::MessageTimer> *__base;
  iteration_time iVar9;
  ActionMessage exec;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined1 local_d8 [16];
  _Manager_type local_c8;
  _Invoker_type p_Stack_c0;
  
  LOCK();
  _Var2 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var2 == false) {
    if (sendRequest) {
      ActionMessage::ActionMessage((ActionMessage *)local_d8,cmd_exec_request);
      local_d8._8_4_ = (this->global_id)._M_i.gid;
      setIterationFlags((ActionMessage *)local_d8,iterate);
      p_Stack_c0 = (_Invoker_type)((ulong)p_Stack_c0 | 0x200000);
      addAction(this,(ActionMessage *)local_d8);
      ActionMessage::~ActionMessage((ActionMessage *)local_d8);
    }
    result = processQueue(this);
    uVar8 = CONCAT71(extraout_var,result) & 0xffffffff;
    updateDataForExecEntry(this,result,iterate);
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
    if (((char)uVar8 == '\0') && (this->realtime != false)) {
      if ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(200);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00563b00;
        pMVar1 = (MessageTimer *)(p_Var5 + 1);
        local_d8._8_4_ = 0;
        local_d8._12_4_ = 0;
        p_Stack_c0 = std::
                     _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:590:21)>
                     ::_M_invoke;
        local_c8 = std::
                   _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:590:21)>
                   ::_M_manager;
        local_d8._0_8_ = this;
        MessageTimer::MessageTimer(pMVar1,(function<void_(helics::ActionMessage_&&)> *)local_d8);
        if (local_c8 != (_Manager_type)0x0) {
          (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
        }
        if ((*(long *)&p_Var5[1]._M_use_count == 0) ||
           (_Stack_e0._M_pi = p_Var5, *(int *)(*(long *)&p_Var5[1]._M_use_count + 8) == 0)) {
          (pMVar1->super_enable_shared_from_this<helics::MessageTimer>)._M_weak_this.
          super___weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar1;
          _Stack_e0._M_pi = p_Var5;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var5[1]._M_use_count,&_Stack_e0)
          ;
        }
        _Var4._M_pi = _Stack_e0._M_pi;
        _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var5 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             pMVar1;
        (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
        }
      }
      rVar6 = std::chrono::_V2::steady_clock::now();
      (this->start_clock_time).__d.__r = rVar6;
    }
    else if ((0 < (this->grantTimeOutPeriod).internalTimeCode) &&
            ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(200);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00563b00;
      pMVar1 = (MessageTimer *)(p_Var5 + 1);
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      p_Stack_c0 = std::
                   _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:596:21)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:596:21)>
                 ::_M_manager;
      local_d8._0_8_ = this;
      MessageTimer::MessageTimer(pMVar1,(function<void_(helics::ActionMessage_&&)> *)local_d8);
      if (local_c8 != (_Manager_type)0x0) {
        (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
      }
      if ((*(long *)&p_Var5[1]._M_use_count == 0) ||
         (_Stack_e0._M_pi = p_Var5, *(int *)(*(long *)&p_Var5[1]._M_use_count + 8) == 0)) {
        (pMVar1->super_enable_shared_from_this<helics::MessageTimer>)._M_weak_this.
        super___weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pMVar1;
        _Stack_e0._M_pi = p_Var5;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var5[1]._M_use_count,&_Stack_e0);
      }
      _Var4._M_pi = _Stack_e0._M_pi;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pMVar1;
      (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
      }
    }
    TVar7.internalTimeCode = (this->time_granted).internalTimeCode;
  }
  else {
    if (((this->queueProcessing)._M_base._M_i & 1U) == 0) {
      sched_yield();
      if (((this->queueProcessing)._M_base._M_i & 1U) == 0) {
        iVar9 = enterExecutingMode(this,iterate,sendRequest);
        TVar7 = iVar9.grantedTime.internalTimeCode;
        uVar8 = (ulong)iVar9._8_4_;
        goto LAB_0032d589;
      }
    }
    sleeplock(this);
    FVar3 = (this->state)._M_i;
    uVar8 = 2;
    if (FVar3 < UNKNOWN) {
      uVar8 = 0x30702000202U >> (FVar3 * '\b' & 0x3f) & 0xffffffff;
    }
    TVar7.internalTimeCode = (this->time_granted).internalTimeCode;
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
LAB_0032d589:
  iVar9._8_8_ = uVar8;
  iVar9.grantedTime.internalTimeCode = TVar7.internalTimeCode;
  return iVar9;
}

Assistant:

iteration_time FederateState::enterExecutingMode(IterationRequest iterate, bool sendRequest)
{
    if (try_lock()) {  // only enter this loop once per federate
        // timeCoord->enteringExecMode (iterate);
        if (sendRequest) {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            setIterationFlags(exec, iterate);
            setActionFlag(exec, indicator_flag);
            addAction(exec);
        }

        auto ret = processQueue();
        updateDataForExecEntry(ret, iterate);
        unlock();
#ifndef HELICS_DISABLE_ASIO
        if ((realtime) && (ret == MessageProcessingResult::NEXT_STEP)) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
            start_clock_time = std::chrono::steady_clock::now();
        } else if (grantTimeOutPeriod > timeZero) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
        }
#endif
        return {time_granted, static_cast<IterationResult>(ret)};
    }

    // if this is not true then try again the core may have been handing something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return enterExecutingMode(iterate, sendRequest);
        }
    }

    // the following code is for a situation in which this method has been called multiple times
    // from different threads, which really shouldn't be done but it isn't really an error so we
    // need to deal with it.
    const std::lock_guard<FederateState> plock(*this);
    IterationResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        case FederateStates::CREATED:
        case FederateStates::INITIALIZING:
        default:
            ret = IterationResult::ITERATING;
            break;
        case FederateStates::EXECUTING:
            ret = IterationResult::NEXT_STEP;
            break;
    }
    return {time_granted, ret};
}